

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::SearchCachedNFA(int iters,char *regexp,StringPiece *text,Anchor anchor,bool expect_match)

{
  Prog *this;
  StringPiece *text_00;
  bool bVar1;
  ostream *poVar2;
  LogMessage local_4f0;
  StringPiece local_370;
  int local_35c;
  undefined1 local_358 [4];
  int i;
  Prog *local_1d8;
  Prog *prog;
  LogMessage local_1c0;
  StringPiece local_40;
  Regexp *local_30;
  Regexp *re;
  bool expect_match_local;
  StringPiece *pSStack_20;
  Anchor anchor_local;
  StringPiece *text_local;
  char *regexp_local;
  int iters_local;
  
  re._3_1_ = expect_match;
  re._4_4_ = anchor;
  pSStack_20 = text;
  text_local = (StringPiece *)regexp;
  regexp_local._4_4_ = iters;
  StringPiece::StringPiece(&local_40,regexp);
  local_30 = Regexp::Parse(&local_40,LikePerl,(RegexpStatus *)0x0);
  if (local_30 == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x3d7);
    poVar2 = LogMessage::stream(&local_1c0);
    std::operator<<(poVar2,"Check failed: re");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1c0);
  }
  local_1d8 = Regexp::CompileToProg(local_30,0);
  if (local_1d8 == (Prog *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_358,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x3d9);
    poVar2 = LogMessage::stream((LogMessage *)local_358);
    std::operator<<(poVar2,"Check failed: prog");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_358);
  }
  for (local_35c = 0; text_00 = pSStack_20, this = local_1d8, local_35c < regexp_local._4_4_;
      local_35c = local_35c + 1) {
    StringPiece::StringPiece(&local_370,(char *)0x0);
    bVar1 = Prog::SearchNFA(this,text_00,&local_370,re._4_4_,kFirstMatch,(StringPiece *)0x0,0);
    if (bVar1 != (bool)(re._3_1_ & 1)) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_4f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x3dc);
      poVar2 = LogMessage::stream(&local_4f0);
      std::operator<<(poVar2,
                      "Check failed: (prog->SearchNFA(text, __null, anchor, Prog::kFirstMatch, __null, 0)) == (expect_match)"
                     );
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4f0);
    }
  }
  if (local_1d8 != (Prog *)0x0) {
    Prog::~Prog(local_1d8);
    operator_delete(this);
  }
  Regexp::Decref(local_30);
  return;
}

Assistant:

void SearchCachedNFA(int iters, const char* regexp, const StringPiece& text,
                     Prog::Anchor anchor, bool expect_match) {
  Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
  CHECK(re);
  Prog* prog = re->CompileToProg(0);
  CHECK(prog);
  for (int i = 0; i < iters; i++) {
    CHECK_EQ(prog->SearchNFA(text, NULL, anchor, Prog::kFirstMatch, NULL, 0),
             expect_match);
  }
  delete prog;
  re->Decref();
}